

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Performance::anon_unknown_1::OperatorPerformanceCase::init
          (OperatorPerformanceCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  pointer pPVar1;
  RenderContext *renderCtx;
  pointer pPVar2;
  OperatorPerformanceCase *pOVar3;
  vector<de::SharedPtr<glu::ShaderProgram>,std::allocator<de::SharedPtr<glu::ShaderProgram>>>
  *pvVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  int extraout_EAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int *piVar9;
  TestLog *pTVar10;
  MessageBuilder *pMVar11;
  ShaderProgram *pSVar12;
  TestError *this_01;
  size_t in_RCX;
  size_t __n;
  void *__buf;
  void *__buf_00;
  long lVar13;
  long lVar14;
  int local_404;
  OperatorPerformanceCase *local_400;
  vector<de::SharedPtr<glu::ShaderProgram>,std::allocator<de::SharedPtr<glu::ShaderProgram>>>
  *local_3f8;
  ShaderProgram *local_3f0;
  long local_3e8;
  string *local_3e0;
  string local_3d8;
  string local_3b8;
  string local_398;
  LogSection local_378;
  undefined1 local_338 [8];
  float fStack_330;
  int iStack_32c;
  pointer local_328;
  float local_320;
  undefined1 local_1b8 [8];
  pointer pPStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  undefined4 extraout_var_02;
  
  pSVar12 = (ShaderProgram *)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar7 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  local_3f8 = (vector<de::SharedPtr<glu::ShaderProgram>,std::allocator<de::SharedPtr<glu::ShaderProgram>>>
               *)CONCAT44(extraout_var,iVar7);
  iVar7 = this->m_viewportWidth;
  local_400 = this;
  iVar8 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  if ((0 < iVar7) && (iVar7 <= *(int *)CONCAT44(extraout_var_00,iVar8))) {
    iVar7 = local_400->m_viewportHeight;
    iVar8 = (*local_400->m_renderCtx->_vptr_RenderContext[4])();
    if ((0 < iVar7) && (iVar7 <= *(int *)(CONCAT44(extraout_var_01,iVar8) + 4))) {
      iVar7 = (*local_400->m_renderCtx->_vptr_RenderContext[4])();
      piVar9 = (int *)CONCAT44(extraout_var_02,iVar7);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d8,"RenderTarget",(allocator<char> *)&local_398);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b8,"Render target",(allocator<char> *)&local_404);
      tcu::LogSection::LogSection(&local_378,&local_3d8,&local_3b8);
      tcu::LogSection::write(&local_378,(int)pSVar12,__buf,in_RCX);
      local_1b8 = (undefined1  [8])pSVar12;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pPStack_1b0);
      std::operator<<((ostream *)&pPStack_1b0,"size: ");
      std::ostream::operator<<((ostringstream *)&pPStack_1b0,*piVar9);
      std::operator<<((ostream *)&pPStack_1b0,"x");
      local_3f0 = pSVar12;
      std::ostream::operator<<((ostringstream *)&pPStack_1b0,piVar9[1]);
      pTVar10 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
      local_338._0_4_ = SUB84(pTVar10,0);
      local_338._4_4_ = (undefined4)((ulong)pTVar10 >> 0x20);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_330);
      std::operator<<((ostream *)&fStack_330,"bits:");
      std::operator<<((ostream *)&fStack_330," R");
      pMVar11 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_338,piVar9 + 2);
      std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>," G");
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,piVar9 + 3);
      std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>," B");
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,piVar9 + 4);
      std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>," A");
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,piVar9 + 5);
      this_00 = &pMVar11->m_str;
      std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>," D");
      std::ostream::operator<<(this_00,piVar9[6]);
      std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>," S");
      std::ostream::operator<<(this_00,piVar9[7]);
      tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_330);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pPStack_1b0);
      tcu::LogSection::~LogSection(&local_378);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_3d8);
      pSVar12 = local_3f0;
      local_338._0_4_ = SUB84(local_3f0,0);
      uVar5 = local_338._0_4_;
      local_338._4_4_ = (undefined4)((ulong)local_3f0 >> 0x20);
      uVar6 = local_338._4_4_;
      if (piVar9[8] == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_330);
        std::operator<<((ostream *)&fStack_330,"No MSAA");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_330);
        std::ostream::operator<<((ostringstream *)&fStack_330,piVar9[8]);
        std::operator<<((ostream *)&fStack_330,"x MSAA");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_330);
      tcu::TestLog::endSection((TestLog *)pSVar12);
      local_338._0_4_ = uVar5;
      local_338._4_4_ = uVar6;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_330);
      std::operator<<((ostream *)&fStack_330,"Using additive blending.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_330);
      pvVar4 = local_3f8;
      (**(code **)(local_3f8 + 0x5e0))(0xbe2);
      (**(code **)(pvVar4 + 0x100))(0x8006);
      (**(code **)(pvVar4 + 0x120))(1,1);
      pOVar3 = local_400;
      (*(local_400->super_TestCase).super_TestNode._vptr_TestNode[5])
                ((SharedPtr<glu::ShaderProgram> *)local_1b8,local_400);
      local_328 = (pOVar3->m_programData).
                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pOVar3->m_programData).
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1a8[0]._0_8_;
      pPVar1 = (pOVar3->m_programData).
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar2 = (pOVar3->m_programData).
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (pOVar3->m_programData).
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1b8;
      (pOVar3->m_programData).
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
      ._M_impl.super__Vector_impl_data._M_finish = pPStack_1b0;
      local_338._0_4_ = SUB84(pPVar1,0);
      local_338._4_4_ = (undefined4)((ulong)pPVar1 >> 0x20);
      fStack_330 = SUB84(pPVar2,0);
      iStack_32c = (int)((ulong)pPVar2 >> 0x20);
      local_1b8 = (undefined1  [8])0x0;
      pPStack_1b0 = (pointer)0x0;
      local_1a8[0]._M_allocated_capacity = (pointer)0x0;
      std::
      vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
      ::~vector((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                 *)local_338);
      std::
      vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
      ::~vector((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                 *)local_1b8);
      local_3f8 = (vector<de::SharedPtr<glu::ShaderProgram>,std::allocator<de::SharedPtr<glu::ShaderProgram>>>
                   *)&pOVar3->m_programs;
      lVar14 = 0x20;
      lVar13 = -1;
      do {
        pOVar3 = local_400;
        pPVar1 = (local_400->m_programData).
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)(int)(((long)(local_400->m_programData).
                               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1) / 0x78) <=
            lVar13 + 1) {
          local_404 = 0;
          while( true ) {
            pOVar3 = local_400;
            __n = (ulong)((long)(local_400->m_programs).
                                super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_400->m_programs).
                               super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4;
            if ((int)__n <= local_404) break;
            de::toString<int>(&local_3d8,&local_404);
            std::operator+(&local_378.m_name,"Program",&local_3d8);
            de::toString<int>(&local_398,&local_404);
            std::operator+(&local_3b8,"Program ",&local_398);
            tcu::LogSection::LogSection((LogSection *)local_1b8,&local_378.m_name,&local_3b8);
            pSVar12 = local_3f0;
            iVar7 = (int)local_3f0;
            tcu::LogSection::write((LogSection *)local_1b8,iVar7,__buf_00,__n);
            local_338._4_4_ = (undefined4)((ulong)pSVar12 >> 0x20);
            local_338._0_4_ = iVar7;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_330);
            std::operator<<((ostream *)&fStack_330,
                            (string *)
                            &(local_400->m_programData).
                             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                             ._M_impl.super__Vector_impl_data._M_start[local_404].description);
            pTVar10 = tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_338,
                                 (EndMessageToken *)&tcu::TestLog::EndMessage);
            pTVar10 = glu::operator<<(pTVar10,*(ShaderProgram **)
                                               (*(long *)local_3f8 + (long)local_404 * 0x10));
            tcu::TestLog::endSection(pTVar10);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_330);
            tcu::LogSection::~LogSection((LogSection *)local_1b8);
            std::__cxx11::string::~string((string *)&local_3b8);
            std::__cxx11::string::~string((string *)&local_398);
            std::__cxx11::string::~string((string *)&local_378);
            std::__cxx11::string::~string((string *)&local_3d8);
            local_404 = local_404 + 1;
          }
          std::vector<int,_std::allocator<int>_>::resize
                    (&local_400->m_highWorkloadSizes,
                     ((long)(local_400->m_programData).
                            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_400->m_programData).
                           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x78);
          std::
          vector<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
          ::resize(&pOVar3->m_workloadRecordsFindHigh,
                   ((long)(pOVar3->m_programData).
                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pOVar3->m_programData).
                         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x78);
          std::
          vector<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
          ::resize(&pOVar3->m_workloadRecords,
                   ((long)(pOVar3->m_programData).
                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pOVar3->m_programData).
                         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x78);
          local_338._0_4_ = ((pOVar3->m_initialCalibrationStorage).m_ptr)->initialNumCalls;
          local_338._4_4_ = 10;
          fStack_330 = 2e+06;
          iStack_32c = 0x10;
          local_328 = (pointer)0x4682355547023555;
          local_320 = 1e+06;
          deqp::gls::TheilSenCalibrator::clear
                    (&pOVar3->m_calibrator,(CalibratorParameters *)local_338);
          pOVar3->m_state = STATE_CALIBRATING;
          prepareProgram(pOVar3,0);
          prepareNextRound(pOVar3);
          return extraout_EAX;
        }
        local_3e0 = (string *)((long)pPVar1 + lVar14 + -0x20);
        local_3e8 = lVar13 + 1;
        pSVar12 = (ShaderProgram *)operator_new(0xd0);
        renderCtx = pOVar3->m_renderCtx;
        glu::makeVtxFragSources
                  ((ProgramSources *)local_338,local_3e0,
                   (string *)((long)&(pPVar1->vertShaderSource)._M_dataplus._M_p + lVar14));
        glu::ShaderProgram::ShaderProgram(pSVar12,renderCtx,(ProgramSources *)local_338);
        de::SharedPtr<glu::ShaderProgram>::SharedPtr
                  ((SharedPtr<glu::ShaderProgram> *)local_1b8,pSVar12);
        std::
        vector<de::SharedPtr<glu::ShaderProgram>,std::allocator<de::SharedPtr<glu::ShaderProgram>>>
        ::emplace_back<de::SharedPtr<glu::ShaderProgram>>
                  (local_3f8,(SharedPtr<glu::ShaderProgram> *)local_1b8);
        lVar14 = lVar14 + 0x78;
        de::SharedPtr<glu::ShaderProgram>::~SharedPtr((SharedPtr<glu::ShaderProgram> *)local_1b8);
        glu::ProgramSources::~ProgramSources((ProgramSources *)local_338);
        pSVar12 = (local_400->m_programs).
                  super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr;
        lVar13 = local_3e8;
      } while ((pSVar12->m_program).m_info.linkOk != false);
      glu::operator<<((TestLog *)local_3f0,pSVar12);
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                 ,0x329);
      goto LAB_011a5934;
    }
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,
             "de::inRange(m_viewportWidth, 1, m_renderCtx.getRenderTarget().getWidth()) && de::inRange(m_viewportHeight, 1, m_renderCtx.getRenderTarget().getHeight())"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
             ,0x311);
LAB_011a5934:
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void OperatorPerformanceCase::init (void)
{
	TestLog&				log		= m_testCtx.getLog();
	const glw::Functions&	gl		= m_renderCtx.getFunctions();

	// Validate that we have sane grid and viewport setup.
	DE_ASSERT(de::inBounds(m_gridSizeX, 1, 256) && de::inBounds(m_gridSizeY, 1, 256));
	TCU_CHECK(de::inRange(m_viewportWidth,	1, m_renderCtx.getRenderTarget().getWidth()) &&
			  de::inRange(m_viewportHeight,	1, m_renderCtx.getRenderTarget().getHeight()));

	logRenderTargetInfo(log, m_renderCtx.getRenderTarget());

	log << TestLog::Message << "Using additive blending." << TestLog::EndMessage;
	gl.enable(GL_BLEND);
	gl.blendEquation(GL_FUNC_ADD);
	gl.blendFunc(GL_ONE, GL_ONE);

	// Generate programs.
	DE_ASSERT(m_programs.empty());
	m_programData = generateProgramData();
	DE_ASSERT(!m_programData.empty());

	for (int progNdx = 0; progNdx < (int)m_programData.size(); progNdx++)
	{
		const string& vert = m_programData[progNdx].vertShaderSource;
		const string& frag = m_programData[progNdx].fragShaderSource;

		m_programs.push_back(SharedPtr<ShaderProgram>(new ShaderProgram(m_renderCtx, glu::makeVtxFragSources(vert, frag))));

		if (!m_programs.back()->isOk())
		{
			log << *m_programs.back();
			TCU_FAIL("Compile failed");
		}
	}

	// Log all programs.
	for (int progNdx = 0; progNdx < (int)m_programs.size(); progNdx++)
		log << TestLog::Section("Program" + de::toString(progNdx), "Program " + de::toString(progNdx))
				<< TestLog::Message << m_programData[progNdx].description << TestLog::EndMessage
				<< *m_programs[progNdx]
			<< TestLog::EndSection;

	m_highWorkloadSizes.resize(m_programData.size());
	m_workloadRecordsFindHigh.resize(m_programData.size());
	m_workloadRecords.resize(m_programData.size());

	m_calibrator.clear(CalibratorParameters(m_initialCalibrationStorage->initialNumCalls, 10 /* calibrate iteration frames */, 2000.0f /* calibrate iteration shortcut threshold (ms) */, 16 /* max calibrate iterations */,
											1000.0f/30.0f /* frame time (ms) */, 1000.0f/60.0f /* frame time cap (ms) */, 1000.0f /* target measure duration (ms) */));
	m_state = STATE_CALIBRATING;

	prepareProgram(0);
	prepareNextRound();
}